

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O0

double calc_mean_only_weighted<float,long,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,long *Xc_ind,
                 long *Xc_indptr,
                 robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *w)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  unsigned_long *__val;
  double *pdVar6;
  long *plVar7;
  long in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  longdouble lVar8;
  long in_stack_00000008;
  size_t *row_1;
  longdouble w_this;
  longdouble m;
  longdouble added;
  size_t row;
  longdouble cnt;
  size_t *ptr_st;
  size_t ind_end_col;
  size_t curr_pos;
  size_t end_col;
  size_t st_col;
  unsigned_long *in_stack_ffffffffffffff28;
  undefined6 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  byte bVar9;
  undefined1 in_stack_ffffffffffffff37;
  undefined1 uVar10;
  unsigned_long *in_stack_ffffffffffffff40;
  unsigned_long *in_stack_ffffffffffffff48;
  undefined2 in_stack_ffffffffffffff50;
  undefined6 in_stack_ffffffffffffff52;
  longdouble local_a8;
  longdouble local_98;
  ulong local_80;
  longdouble local_78;
  long local_50;
  double local_8;
  
  if (*(long *)(in_stack_00000008 + in_RCX * 8) == *(long *)(in_stack_00000008 + 8 + in_RCX * 8)) {
    local_8 = 0.0;
  }
  else {
    local_50 = *(long *)(in_stack_00000008 + in_RCX * 8);
    lVar1 = *(long *)(in_stack_00000008 + 8 + in_RCX * 8);
    lVar5 = lVar1 + -1;
    uVar2 = *(ulong *)(in_R9 + lVar5 * 8);
    __val = std::lower_bound<unsigned_long*,unsigned_long>
                      ((unsigned_long *)
                       CONCAT62(in_stack_ffffffffffffff52,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    local_78 = (longdouble)0;
    for (local_80 = in_RSI; local_80 <= in_RDX; local_80 = local_80 + 1) {
      pdVar6 = tsl::
               robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               ::operator[]((robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                             *)CONCAT17(in_stack_ffffffffffffff37,
                                        CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30
                                                )),in_stack_ffffffffffffff28);
      local_78 = local_78 + (longdouble)*pdVar6;
    }
    local_a8 = (longdouble)0;
    local_98 = local_a8;
    while( true ) {
      uVar10 = false;
      if ((__val != (unsigned_long *)(in_RDI + in_RDX * 8 + 8)) &&
         (uVar10 = false, local_50 != lVar1)) {
        uVar10 = *__val <= uVar2;
      }
      if ((bool)uVar10 == false) break;
      if (*(unsigned_long *)(in_R9 + local_50 * 8) == *__val) {
        uVar3 = std::isnan((double)(ulong)*(uint *)(in_R8 + local_50 * 4));
        bVar9 = 1;
        if ((uVar3 & 1) == 0) {
          iVar4 = std::isinf((double)(ulong)*(uint *)(in_R8 + local_50 * 4));
          bVar9 = (byte)iVar4;
        }
        if ((bVar9 & 1) == 0) {
          pdVar6 = tsl::
                   robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                   ::operator[]((robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                                 *)CONCAT17(uVar10,CONCAT16(bVar9,in_stack_ffffffffffffff30)),
                                in_stack_ffffffffffffff28);
          lVar8 = (longdouble)*pdVar6;
          in_stack_ffffffffffffff48 = SUB108(lVar8,0);
          in_stack_ffffffffffffff50 = (undefined2)((unkuint10)lVar8 >> 0x40);
          local_98 = local_98 + lVar8;
          local_a8 = (lVar8 * ((longdouble)*(float *)(in_R8 + local_50 * 4) - local_a8)) / local_98
                     + local_a8;
        }
        else {
          pdVar6 = tsl::
                   robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                   ::operator[]((robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                                 *)CONCAT17(uVar10,CONCAT16(bVar9,in_stack_ffffffffffffff30)),
                                in_stack_ffffffffffffff28);
          local_78 = local_78 - (longdouble)*pdVar6;
        }
        if ((__val == (unsigned_long *)(in_RDI + in_RDX * 8)) || (local_50 == lVar5)) break;
        __val = __val + 1;
        plVar7 = std::lower_bound<long*,unsigned_long>
                           ((long *)CONCAT62(in_stack_ffffffffffffff52,in_stack_ffffffffffffff50),
                            (long *)in_stack_ffffffffffffff48,__val);
        local_50 = (long)plVar7 - in_R9 >> 3;
      }
      else if ((long)*__val < *(long *)(in_R9 + local_50 * 8)) {
        __val = std::lower_bound<unsigned_long*,long>
                          ((unsigned_long *)
                           CONCAT62(in_stack_ffffffffffffff52,in_stack_ffffffffffffff50),
                           in_stack_ffffffffffffff48,(long *)__val);
      }
      else {
        plVar7 = std::lower_bound<long*,unsigned_long>
                           ((long *)CONCAT62(in_stack_ffffffffffffff52,in_stack_ffffffffffffff50),
                            (long *)in_stack_ffffffffffffff48,__val);
        local_50 = (long)plVar7 - in_R9 >> 3;
      }
    }
    if ((local_98 != (longdouble)0) || (NAN(local_98) || NAN((longdouble)0))) {
      if (local_98 < local_78) {
        local_a8 = local_a8 * (local_98 / local_78);
      }
      local_8 = (double)local_a8;
    }
    else {
      local_8 = 0.0;
    }
  }
  return local_8;
}

Assistant:

double calc_mean_only_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                               real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                               mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return 0;
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    ldouble_safe cnt = 0.;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];
    ldouble_safe added = 0;
    ldouble_safe m = 0;
    ldouble_safe w_this;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos]))) {
                cnt -= w[*row];
            }

            else {
                w_this = w[*row];
                added += w_this;
                m += w_this * (Xc[curr_pos] - m) / added;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
        return 0;

    if (cnt > added)
        m *= (ldouble_safe)added / (ldouble_safe)cnt;

    return m;
}